

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_elast.c
# Opt level: O0

REF_STATUS ref_elast_free(REF_ELAST ref_elast)

{
  REF_ELAST ref_elast_local;
  
  if (ref_elast == (REF_ELAST)0x0) {
    ref_elast_local._4_4_ = 2;
  }
  else {
    if (ref_elast->bc != (REF_INT *)0x0) {
      free(ref_elast->bc);
    }
    if (ref_elast->displacement != (REF_DBL *)0x0) {
      free(ref_elast->displacement);
    }
    if (ref_elast->a != (REF_DBL *)0x0) {
      free(ref_elast->a);
    }
    ref_comprow_free(ref_elast->ref_comprow);
    if (ref_elast != (REF_ELAST)0x0) {
      free(ref_elast);
    }
    ref_elast_local._4_4_ = 0;
  }
  return ref_elast_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_elast_free(REF_ELAST ref_elast) {
  if (NULL == (void *)ref_elast) return REF_NULL;

  ref_free(ref_elast->bc);
  ref_free(ref_elast->displacement);
  ref_free(ref_elast->a);
  ref_comprow_free(ref_elast->ref_comprow);

  ref_free(ref_elast);

  return REF_SUCCESS;
}